

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O3

timestamp_t __thiscall
duckdb::TimeBucket::WidthConvertibleToMonthsBinaryOperator::
Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t>
          (WidthConvertibleToMonthsBinaryOperator *this,interval_t bucket_width,timestamp_t ts)

{
  bool bVar1;
  int32_t left;
  int iVar2;
  int iVar3;
  date_t dVar4;
  timestamp_t ts_00;
  int iVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [12];
  timestamp_t result;
  timestamp_t local_40;
  string local_38;
  
  ts_00.value = bucket_width.micros;
  bVar1 = duckdb::Value::IsFinite<duckdb::timestamp_t>(ts_00);
  if (!bVar1) {
    bVar1 = duckdb::TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>
                      (ts_00,&local_40,false);
    if (bVar1) {
      return (timestamp_t)local_40.value;
    }
    auVar7 = __cxa_allocate_exception(0x10);
    CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_t>
              (&local_38,(duckdb *)ts_00.value,(timestamp_t)auVar7._8_8_);
    duckdb::InvalidInputException::InvalidInputException(auVar7._0_8_,(string *)&local_38);
    __cxa_throw(auVar7._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  left = EpochMonths<duckdb::timestamp_t>(ts_00);
  iVar5 = (int)this;
  iVar6 = (int)(0x168 % (long)iVar5);
  iVar2 = SubtractOperatorOverflowCheck::Operation<int,int,int>(left,iVar6);
  iVar3 = iVar2 - iVar2 % iVar5;
  if (iVar2 % iVar5 != 0 && iVar2 < 0) {
    iVar3 = SubtractOperatorOverflowCheck::Operation<int,int,int>(iVar3,iVar5);
  }
  iVar3 = iVar3 + iVar6;
  iVar2 = iVar3 % 0xc;
  if (iVar2 == 0 || -1 < iVar3) {
    iVar6 = iVar3 / 0xc + 0x7b2;
    iVar5 = 1;
    if (-1 < iVar3) goto LAB_00624a30;
  }
  else {
    iVar6 = 0x7b1 - (uint)-iVar3 / 0xc;
  }
  iVar5 = 0xd;
  if (iVar2 == 0) {
    iVar5 = 1;
  }
LAB_00624a30:
  dVar4.days = duckdb::Date::FromDate(iVar6,iVar5 + iVar2,1);
  bVar1 = duckdb::TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>(dVar4,&local_40,false);
  if (bVar1) {
    return (timestamp_t)local_40.value;
  }
  auVar8 = __cxa_allocate_exception(0x10);
  CastExceptionText<duckdb::date_t,duckdb::timestamp_t>
            (&local_38,(duckdb *)(ulong)(uint)dVar4.days,(date_t)auVar8._8_4_);
  duckdb::InvalidInputException::InvalidInputException(auVar8._0_8_,(string *)&local_38);
  __cxa_throw(auVar8._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int32_t ts_months = EpochMonths(ts);
			return Cast::template Operation<date_t, TR>(
			    WidthConvertibleToMonthsCommon(bucket_width.months, ts_months, DEFAULT_ORIGIN_MONTHS));
		}